

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::GridRenderCase::
genTessellationEvaluationSource_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  ostream *poVar1;
  char *pcVar2;
  char *pcVar3;
  ostringstream buf;
  ostringstream aoStack_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_198);
  poVar1 = std::operator<<((ostream *)aoStack_198,
                           "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n${GPU_SHADER5_REQUIRE}\nlayout(triangles) in;\n\nin highp vec4 tess_ctrl_color[];\nout highp vec4 tess_color;\nuniform highp vec4 u_posScale;\npatch in highp float vp_bbox_expansionSize;\npatch in highp vec3 vp_bbox_clipMin;\npatch in highp vec3 vp_bbox_clipMax;\nflat out highp float v_"
                          );
  pcVar3 = SSBOArrayLengthTests::init::arraysSized + 1;
  pcVar2 = SSBOArrayLengthTests::init::arraysSized + 1;
  if (*(char *)((long)this + 0x81) != '\0') {
    pcVar2 = "geo_";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"bbox_expansionSize;\nflat out highp vec3 v_");
  pcVar2 = SSBOArrayLengthTests::init::arraysSized + 1;
  if (*(char *)((long)this + 0x81) != '\0') {
    pcVar2 = "geo_";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"bbox_clipMin;\nflat out highp vec3 v_");
  pcVar2 = SSBOArrayLengthTests::init::arraysSized + 1;
  if (*(char *)((long)this + 0x81) != '\0') {
    pcVar2 = "geo_";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"bbox_clipMax;\n\nprecise gl_Position;\n\n");
  poVar1 = std::operator<<(poVar1,
                           "vec4 mirrorY(in highp vec4 p)\n{\n\thighp vec2 patternOffset = u_posScale.xy;\n\thighp vec2 patternScale = u_posScale.zw;\n\thighp vec2 patternCenter = patternOffset + patternScale * 0.5;\n\treturn vec4(p.x, 2.0 * patternCenter.y - p.y, p.z, p.w);\n}\n"
                          );
  poVar1 = std::operator<<(poVar1,
                           "void main()\n{\n\t// non-trivial tessellation evaluation shader, convert from nonsensical coords, flip vertically\n\tgl_Position = mirrorY(gl_TessCoord.x * gl_in[0].gl_Position.zwyx +\n\t                      gl_TessCoord.y * gl_in[1].gl_Position.zwyx +\n\t                      gl_TessCoord.z * gl_in[2].gl_Position.zwyx);\n\ttess_color = tess_ctrl_color[0];\n\tv_"
                          );
  pcVar2 = SSBOArrayLengthTests::init::arraysSized + 1;
  if (*(char *)((long)this + 0x81) != '\0') {
    pcVar2 = "geo_";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"bbox_expansionSize = vp_bbox_expansionSize;\n\tv_");
  pcVar2 = SSBOArrayLengthTests::init::arraysSized + 1;
  if (*(char *)((long)this + 0x81) != '\0') {
    pcVar2 = "geo_";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"bbox_clipMin = vp_bbox_clipMin;\n\tv_");
  if (*(char *)((long)this + 0x81) != '\0') {
    pcVar3 = "geo_";
  }
  poVar1 = std::operator<<(poVar1,pcVar3);
  std::operator<<(poVar1,"bbox_clipMax = vp_bbox_clipMax;\n}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(aoStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string GridRenderCase::genTessellationEvaluationSource (void) const
{
	std::ostringstream	buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"${TESSELLATION_SHADER_REQUIRE}\n"
			"${GPU_SHADER5_REQUIRE}\n"
			"layout(triangles) in;\n"
			"\n"
			"in highp vec4 tess_ctrl_color[];\n"
			"out highp vec4 tess_color;\n"
			"uniform highp vec4 u_posScale;\n"
			"patch in highp float vp_bbox_expansionSize;\n"
			"patch in highp vec3 vp_bbox_clipMin;\n"
			"patch in highp vec3 vp_bbox_clipMax;\n"
			"flat out highp float v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_expansionSize;\n"
			"flat out highp vec3 v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_clipMin;\n"
			"flat out highp vec3 v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_clipMax;\n"
			"\n"
			"precise gl_Position;\n"
			"\n"
		<<	genShaderFunction(SHADER_FUNC_MIRROR_Y)
		<<	"void main()\n"
			"{\n"
			"	// non-trivial tessellation evaluation shader, convert from nonsensical coords, flip vertically\n"
			"	gl_Position = mirrorY(gl_TessCoord.x * gl_in[0].gl_Position.zwyx +\n"
			"	                      gl_TessCoord.y * gl_in[1].gl_Position.zwyx +\n"
			"	                      gl_TessCoord.z * gl_in[2].gl_Position.zwyx);\n"
			"	tess_color = tess_ctrl_color[0];\n"
			"	v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_expansionSize = vp_bbox_expansionSize;\n"
			"	v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_clipMin = vp_bbox_clipMin;\n"
			"	v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_clipMax = vp_bbox_clipMax;\n"
			"}\n";

	return buf.str();
}